

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

bool __thiscall
libcellml::Variable::VariableImpl::unsetEquivalentTo
          (VariableImpl *this,VariablePtr *equivalentVariable)

{
  _Atomic_word *p_Var1;
  _Rb_tree_header *p_Var2;
  weak_ptr<libcellml::Variable> *pwVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  int iVar6;
  iterator __position;
  _Base_ptr p_Var7;
  const_iterator cVar8;
  bool bVar9;
  
  cleanExpiredVariables(this);
  __position = findEquivalentVariable(this,equivalentVariable);
  pwVar3 = (this->mEquivalentVariables).
           super__Vector_base<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current != pwVar3) {
    std::
    vector<std::weak_ptr<libcellml::Variable>,_std::allocator<std::weak_ptr<libcellml::Variable>_>_>
    ::_M_erase(&this->mEquivalentVariables,__position);
    p_Var4 = (_Base_ptr)
             (equivalentVariable->
             super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var4 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    p_Var2 = &(this->mMappingIdMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->mMappingIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var2->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar9]) {
      bVar9 = p_Var5[1]._M_parent < p_Var4;
      if (!bVar9) {
        p_Var7 = p_Var5;
      }
    }
    cVar8._M_node = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var2) &&
       (cVar8._M_node = p_Var7, p_Var4 < p_Var7[1]._M_parent)) {
      cVar8._M_node = &p_Var2->_M_header;
    }
    if (p_Var4 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        iVar6 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = *(_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        *(int *)((long)&p_Var4->_M_parent + 4) = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(*(_func_int ***)&p_Var4->_M_color)[3])();
      }
    }
    if ((_Rb_tree_header *)cVar8._M_node != p_Var2) {
      std::
      _Rb_tree<std::weak_ptr<libcellml::Variable>,_std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&(this->mMappingIdMap)._M_t,cVar8);
    }
    p_Var4 = (_Base_ptr)
             (equivalentVariable->
             super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if (p_Var4 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        *p_Var1 = *p_Var1 + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        *p_Var1 = *p_Var1 + 1;
      }
    }
    p_Var2 = &(this->mConnectionIdMap)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = (this->mConnectionIdMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var7 = &p_Var2->_M_header;
    for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[bVar9]) {
      bVar9 = p_Var5[1]._M_parent < p_Var4;
      if (!bVar9) {
        p_Var7 = p_Var5;
      }
    }
    cVar8._M_node = &p_Var2->_M_header;
    if (((_Rb_tree_header *)p_Var7 != p_Var2) &&
       (cVar8._M_node = p_Var7, p_Var4 < p_Var7[1]._M_parent)) {
      cVar8._M_node = &p_Var2->_M_header;
    }
    if (p_Var4 != (_Base_ptr)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        iVar6 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar6 = *(_Atomic_word *)((long)&p_Var4->_M_parent + 4);
        *(int *)((long)&p_Var4->_M_parent + 4) = iVar6 + -1;
      }
      if (iVar6 == 1) {
        (*(*(_func_int ***)&p_Var4->_M_color)[3])();
      }
    }
    if ((_Rb_tree_header *)cVar8._M_node != p_Var2) {
      std::
      _Rb_tree<std::weak_ptr<libcellml::Variable>,_std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_M_erase_aux(&(this->mConnectionIdMap)._M_t,cVar8);
    }
  }
  return __position._M_current != pwVar3;
}

Assistant:

bool Variable::VariableImpl::unsetEquivalentTo(const VariablePtr &equivalentVariable)
{
    cleanExpiredVariables();
    bool status = false;
    auto result = findEquivalentVariable(equivalentVariable);
    if (result != mEquivalentVariables.end()) {
        mEquivalentVariables.erase(result);
        auto mappingIdResult = mMappingIdMap.find(equivalentVariable);
        if (mappingIdResult != mMappingIdMap.end()) {
            mMappingIdMap.erase(mappingIdResult);
        }
        auto connectionIdResult = mConnectionIdMap.find(equivalentVariable);
        if (connectionIdResult != mConnectionIdMap.end()) {
            mConnectionIdMap.erase(connectionIdResult);
        }
        status = true;
    }

    return status;
}